

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManPrintRepr(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  uint local_1c;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if ((int)local_1c < p->nObjs) {
      pGVar1 = Gia_ManObj(p,local_1c);
      bVar2 = pGVar1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    if (p->pReprsOld[(int)local_1c] != -1) {
      printf("%d->%d ",(ulong)local_1c,(ulong)((uint)p->pReprs[(int)local_1c] & 0xfffffff));
    }
    local_1c = local_1c + 1;
  }
  printf("\n");
  return;
}

Assistant:

void Gia_ManPrintRepr( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
        if ( ~p->pReprsOld[i] )
            printf( "%d->%d ", i, p->pReprs[i].iRepr );
    printf( "\n" );
}